

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O0

agent_queue_ref_t __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::make_new_agent_queue
          (dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
           *this,bind_params_t *params)

{
  agent_queue_t *this_00;
  params_t *in_RDX;
  bind_params_t *params_local;
  dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
  *this_local;
  
  this_00 = (agent_queue_t *)operator_new(0x70);
  thread_pool::impl::agent_queue_t::agent_queue_t(this_00,(dispatcher_queue_t *)(params + 1),in_RDX)
  ;
  intrusive_ptr_t<so_5::disp::thread_pool::impl::agent_queue_t>::intrusive_ptr_t
            ((intrusive_ptr_t<so_5::disp::thread_pool::impl::agent_queue_t> *)this,this_00);
  return (agent_queue_ref_t)(agent_queue_t *)this;
}

Assistant:

agent_queue_ref_t
		make_new_agent_queue(
			const PARAMS & params )
			{
				return agent_queue_ref_t(
						new AGENT_QUEUE{ m_queue, params } );
			}